

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O3

int djnz_rx_offset(em8051 *aCPU)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = aCPU->mSFR[0x50] & 0x18 |
          aCPU->mCodeMem[(long)aCPU->mCodeMemSize - 1U & (long)aCPU->mPC] & 7;
  aCPU->mLowerData[uVar1] = aCPU->mLowerData[uVar1] + 0xff;
  if (aCPU->mLowerData[uVar1] == '\0') {
    iVar2 = aCPU->mPC;
  }
  else {
    iVar2 = (int)(char)aCPU->mCodeMem[(long)aCPU->mCodeMemSize - 1U & (long)aCPU->mPC + 1U] +
            aCPU->mPC;
  }
  aCPU->mPC = iVar2 + 2;
  return 1;
}

Assistant:

static int djnz_rx_offset(struct em8051 *aCPU)
{
    int rx = RX_ADDRESS;
    aCPU->mLowerData[rx]--;
    if (aCPU->mLowerData[rx])
    {
        PC += (signed char)OPERAND1 + 2;
    }
    else
    {
        PC += 2;
    }
    return 1;
}